

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_all.hpp
# Opt level: O3

tuple<const_int_&,_const_int_&>
burst::detail::
by_all_impl<0ul,1ul,burst::front_t,std::tuple<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>const&,boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>&>>
          (_Tuple_impl<1UL,_const_int_&> param_1,undefined8 param_2,long *param_3)

{
  long lVar1;
  _Head_base<0UL,_const_int_&,_false> _Var2;
  tuple<const_int_&,_const_int_&> tVar3;
  
  lVar1 = *(long *)param_3[1];
  if (lVar1 != ((long *)param_3[1])[1]) {
    _Var2._M_head_impl = (int *)*param_3;
    if (*(long *)_Var2._M_head_impl != *(long *)(_Var2._M_head_impl + 2)) {
      *(long *)param_1.super__Head_base<1UL,_const_int_&,_false>._M_head_impl =
           *(long *)_Var2._M_head_impl;
      *(long *)((long)param_1.super__Head_base<1UL,_const_int_&,_false>._M_head_impl + 8) = lVar1;
      tVar3.super__Tuple_impl<0UL,_const_int_&,_const_int_&>.
      super__Head_base<0UL,_const_int_&,_false>._M_head_impl = _Var2._M_head_impl;
      tVar3.super__Tuple_impl<0UL,_const_int_&,_const_int_&>.super__Tuple_impl<1UL,_const_int_&>.
      super__Head_base<1UL,_const_int_&,_false>._M_head_impl =
           param_1.super__Head_base<1UL,_const_int_&,_false>._M_head_impl;
      return (tuple<const_int_&,_const_int_&>)tVar3.super__Tuple_impl<0UL,_const_int_&,_const_int_&>
      ;
    }
  }
  __assert_fail("!empty()","/usr/include/boost/range/iterator_range_core.hpp",0xff,
                "reference boost::iterator_range_detail::iterator_range_base<__gnu_cxx::__normal_iterator<const int *, std::vector<int>>, boost::iterators::incrementable_traversal_tag>::front() const [IteratorT = __gnu_cxx::__normal_iterator<const int *, std::vector<int>>, TraversalTag = boost::iterators::incrementable_traversal_tag]"
               );
}

Assistant:

constexpr decltype(auto)
            by_all_impl (std::index_sequence<Indices...>, UnaryFunction & f, Tuple && t)
        {
            return
                std::tuple
                <
                    invoke_result_t
                    <
                        UnaryFunction &, std::tuple_element_t<Indices, std::decay_t<Tuple>>
                    >...
                >
                (
                    f(std::get<Indices>(std::forward<Tuple>(t)))...
                );
        }